

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_corofile.cpp
# Opt level: O0

void test_seq_read_write<(coro_io::execution_type)2>(string_view filename)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view filepath;
  string_view buf_00;
  _Ios_Openmode _Var1;
  string str;
  size_t size;
  error_code ec;
  char buf [100];
  basic_seq_coro_file<(coro_io::execution_type)2> file;
  basic_seq_coro_file<(coro_io::execution_type)2> *in_stack_fffffffffffffb40;
  pair<std::error_code,_unsigned_long> *in_stack_fffffffffffffb48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb50;
  allocator_type *in_stack_fffffffffffffb68;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_fffffffffffffb70;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffb78;
  openmode in_stack_fffffffffffffb7c;
  char *__s;
  basic_seq_coro_file<(coro_io::execution_type)2> *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_fffffffffffffb88;
  undefined1 **local_458;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy;
  allocator<char> local_3e9 [9];
  anon_class_8_1_898ba27a *in_stack_fffffffffffffc20;
  anon_class_8_1_89918cff *in_stack_fffffffffffffc30;
  char local_3c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390 [2];
  basic_seq_coro_file<(coro_io::execution_type)2> *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  basic_seq_coro_file<(coro_io::execution_type)2> *in_stack_fffffffffffffcd0;
  char local_2e0 [136];
  size_t in_stack_fffffffffffffda8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdb0;
  Lazy<std::pair<std::error_code,_unsigned_long>_> local_76 [2];
  allocator<char> local_61;
  undefined8 *local_60;
  undefined1 *local_58 [4];
  undefined8 *local_38;
  undefined8 local_30;
  
  local_76[0].super_LazyBase<std::pair<std::error_code,_unsigned_long>,_false>._coro.__handle_._1_1_
       = 1;
  local_60 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb80,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (allocator<char> *)in_stack_fffffffffffffb70);
  local_76[0].super_LazyBase<std::pair<std::error_code,_unsigned_long>,_false>._coro.__handle_._1_1_
       = 0;
  local_38 = local_58;
  local_30 = 1;
  lazy = local_76;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x17f9c1);
  __l._M_array._4_4_ = in_stack_fffffffffffffb7c;
  __l._M_array._0_4_ = in_stack_fffffffffffffb78;
  __l._M_len = (size_type)in_stack_fffffffffffffb80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffb70,__l,in_stack_fffffffffffffb68);
  create_files(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffb50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_76);
  local_458 = (undefined1 **)&local_38;
  do {
    local_458 = local_458 + -4;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb40);
  } while (local_458 != local_58);
  std::allocator<char>::~allocator(&local_61);
  _Var1 = std::operator|(_S_in,_S_out);
  std::thread::hardware_concurrency();
  coro_io::get_global_block_executor<coro_io::io_context_pool>(0);
  filepath._M_len._4_4_ = _Var1;
  filepath._M_len._0_4_ = in_stack_fffffffffffffb88;
  filepath._M_str = local_2e0;
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::basic_seq_coro_file
            (in_stack_fffffffffffffb80,filepath,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb70)
  ;
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            (in_stack_fffffffffffffc20);
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            (in_stack_fffffffffffffc20);
  std::error_code::error_code((error_code *)in_stack_fffffffffffffb40);
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::async_read
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(size_t)in_stack_fffffffffffffcc0);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            (lazy);
  __s = local_3c0;
  this = local_390;
  std::tie<std::error_code,unsigned_long>
            (&in_stack_fffffffffffffb48->first,(unsigned_long *)in_stack_fffffffffffffb40);
  std::tuple<std::error_code&,unsigned_long&>::operator=
            ((tuple<std::error_code_&,_unsigned_long_&> *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x17fb7e);
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_89918cff::operator()
            (in_stack_fffffffffffffc30);
  __a = local_3e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
  std::allocator<char>::~allocator(local_3e9);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40);
  buf_00._M_str = (char *)in_stack_fffffffffffffcd0;
  buf_00._M_len = (size_t)in_stack_fffffffffffffcc8;
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::async_write
            (in_stack_fffffffffffffcc0,buf_00);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            (lazy);
  std::tie<std::error_code,unsigned_long>
            (&in_stack_fffffffffffffb48->first,(unsigned_long *)in_stack_fffffffffffffb40);
  std::tuple<std::error_code&,unsigned_long&>::operator=
            ((tuple<std::error_code_&,_unsigned_long_&> *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x17fc75);
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_89918cff::operator()
            (in_stack_fffffffffffffc30);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40);
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::~basic_seq_coro_file
            (in_stack_fffffffffffffb40);
  return;
}

Assistant:

void test_seq_read_write(std::string_view filename) {
  create_files({std::string(filename)}, 190);
  coro_io::basic_seq_coro_file<execute_type> file(filename,
                                                  std::ios::in | std::ios::out);
  CHECK(file.is_open());
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
  if (execute_type == coro_io::execution_type::native_async) {
    CHECK(file.get_execution_type() == coro_io::execution_type::native_async);
  }
#else
  CHECK(file.get_execution_type() == coro_io::execution_type::thread_pool);
#endif
  char buf[100];
  std::error_code ec;
  size_t size;
  std::tie(ec, size) = async_simple::coro::syncAwait(file.async_read(buf, 10));
  CHECK(size == 10);

  std::string str = "test";
  std::tie(ec, size) = async_simple::coro::syncAwait(file.async_write(str));
  CHECK(size == 4);
}